

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

result_type __thiscall
Catch::uniform_integer_distribution<unsigned_long>::operator()
          (uniform_integer_distribution<unsigned_long> *this,SimplePcg32 *g)

{
  UnsignedIntegerType UVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  
  UVar1 = this->m_ab_distance;
  uVar4 = std::enable_if<(sizeof(Catch::SimplePcg32::
          result_type))<(sizeof(unsigned_long)),unsigned_long>::type_Catch::Detail::
          fillBitsFrom<unsigned_long,Catch::SimplePcg32>(g);
  if (UVar1 != 0) {
    while (auVar2._8_8_ = 0, auVar2._0_8_ = uVar4, auVar3._8_8_ = 0,
          auVar3._0_8_ = this->m_ab_distance,
          SUB168(auVar2 * auVar3,0) < this->m_rejection_threshold) {
      uVar4 = std::enable_if<(sizeof(Catch::SimplePcg32::
              result_type))<(sizeof(unsigned_long)),unsigned_long>::type_Catch::Detail::
              fillBitsFrom<unsigned_long,Catch::SimplePcg32>(g);
    }
    uVar4 = SUB168(auVar2 * auVar3,8) + this->m_a;
  }
  return uVar4;
}

Assistant:

result_type operator()( Generator& g ) {
        // All possible values of result_type are valid.
        if ( m_ab_distance == 0 ) {
            return transposeBack( Detail::fillBitsFrom<UnsignedIntegerType>( g ) );
        }

        auto random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
        auto emul = Detail::extendedMult( random_number, m_ab_distance );
        // Unlike Lemire's algorithm we skip the ab_distance check, since
        // we precomputed the rejection threshold, which is always tighter.
        while (emul.lower < m_rejection_threshold) {
            random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
            emul = Detail::extendedMult( random_number, m_ab_distance );
        }

        return transposeBack(m_a + emul.upper);
    }